

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

Ptr __thiscall r_comp::RepliMacro::expandMacro(RepliMacro *this,RepliStruct *oldStruct)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  __fn *in_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  string *this_00;
  void *in_R8;
  undefined8 *puVar7;
  Ptr PVar8;
  Ptr findStruct;
  undefined1 local_138 [40];
  undefined1 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(long *)((long)&(oldStruct->cmd).field_2 + 8) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "\' source not defined. ");
    std::__cxx11::string::append((string *)((oldStruct->tail).field_2._M_local_buf + 8));
LAB_0012dfa0:
    std::__cxx11::string::~string((string *)local_138);
    this_00 = (string *)local_110;
  }
  else {
    if ((oldStruct->tail)._M_string_length == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "\' destination not defined. ");
      std::__cxx11::string::append((string *)((oldStruct->tail).field_2._M_local_buf + 8));
      goto LAB_0012dfa0;
    }
    if (in_RDX == (__fn *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "\' cannot expand empty structure. ");
      std::__cxx11::string::append((string *)((oldStruct->tail).field_2._M_local_buf + 8));
      goto LAB_0012dfa0;
    }
    iVar4 = std::__cxx11::string::compare((string *)(in_RDX + 8));
    if (iVar4 == 0) {
      lVar5 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      plVar1 = (long *)(lVar5 + 0xb8);
      plVar2 = (long *)(lVar5 + 0xb0);
      if (*plVar1 == *plVar2) {
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
        if (*(long *)(in_RDX + 0xb8) != *(long *)(in_RDX + 0xb0)) {
          RepliStruct::clone((RepliStruct *)local_138,in_RDX,__child_stack,(int)lVar5,in_R8);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)this,
                     (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)local_138);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
          std::__cxx11::string::_M_assign((string *)((this->name)._M_dataplus._M_p + 8));
          std::__cxx11::string::_M_assign((string *)((this->name)._M_dataplus._M_p + 0x48));
          _Var6._M_pi = extraout_RDX_00;
          goto LAB_0012dfb8;
        }
      }
      else {
        lVar5 = *(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0);
        if (*plVar1 - *plVar2 != lVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0xc0),"Macro \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         oldStruct);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0xa0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0xc0),"\' requires ");
          lVar5 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
          std::__cxx11::to_string
                    ((string *)(local_110 + 0x80),
                     *(long *)(lVar5 + 0xb8) - *(long *)(lVar5 + 0xb0) >> 4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x40),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0xa0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x80));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x40)," arguments, cannot expand structure with ");
          std::__cxx11::to_string
                    ((string *)(local_110 + 0x60),
                     *(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0) >> 4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x20),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_110 + 0x60));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110," arguments. ");
          std::__cxx11::string::append((string *)((oldStruct->tail).field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)local_110);
          std::__cxx11::string::~string((string *)(local_110 + 0x60));
          std::__cxx11::string::~string((string *)(local_110 + 0x20));
          std::__cxx11::string::~string((string *)(local_110 + 0x40));
          std::__cxx11::string::~string((string *)(local_110 + 0x80));
          std::__cxx11::string::~string((string *)(local_110 + 0xa0));
          this_00 = (string *)(local_110 + 0xc0);
          goto LAB_0012dfad;
        }
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
      }
      RepliStruct::clone((RepliStruct *)local_138,(__fn *)(oldStruct->tail)._M_string_length,
                         __child_stack,(int)lVar5,in_R8);
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)local_138);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
      std::__cxx11::string::_M_assign((string *)((this->name)._M_dataplus._M_p + 0x48));
      local_138._0_8_ = (RepliStruct *)0x0;
      local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      puVar7 = *(undefined8 **)(in_RDX + 0xb0);
      lVar5 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      lVar3 = *(long *)(lVar5 + 0xb8);
      for (lVar5 = *(long *)(lVar5 + 0xb0); lVar5 != lVar3; lVar5 = lVar5 + 0x10) {
        RepliStruct::findAtom((RepliStruct *)local_110,(string *)(this->name)._M_dataplus._M_p);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)local_138,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)local_110);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
        if ((RepliStruct *)local_138._0_8_ != (RepliStruct *)0x0) {
          RepliStruct::operator=((RepliStruct *)local_138._0_8_,(RepliStruct *)*puVar7);
        }
        puVar7 = puVar7 + 2;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
      _Var6._M_pi = extraout_RDX_01;
      goto LAB_0012dfb8;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_110 + 0x40),"Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_110 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_110 + 0x40),"\' cannot expand structure with different name \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_110 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX + 8)
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "\'. ");
    std::__cxx11::string::append((string *)((oldStruct->tail).field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)(local_110 + 0x20));
    this_00 = (string *)(local_110 + 0x40);
  }
LAB_0012dfad:
  std::__cxx11::string::~string(this_00);
  (this->name)._M_dataplus._M_p = (pointer)0x0;
  (this->name)._M_string_length = 0;
  _Var6._M_pi = extraout_RDX;
LAB_0012dfb8:
  PVar8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  PVar8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliMacro::expandMacro(RepliStruct *oldStruct)
{
    if (src == nullptr) {
        error += "Macro '" + name + "' source not defined. ";
        return nullptr;
    }

    if (dest == nullptr) {
        error += "Macro '" + name + "' destination not defined. ";
        return nullptr;
    }

    if (oldStruct == nullptr) {
        error += "Macro '" + name + "' cannot expand empty structure. ";
        return nullptr;
    }

    if (oldStruct->cmd.compare(this->name) != 0) {
        error += "Macro '" + name + "' cannot expand structure with different name '" + oldStruct->cmd + "'. ";
        return nullptr;
    }

    if ((src->args.size() > 0) && (src->args.size() != oldStruct->args.size())) {
        error += "Macro '" + name + "' requires " + std::to_string(src->args.size()) + " arguments, cannot expand structure with " + std::to_string(oldStruct->args.size()) + " arguments. ";
        return nullptr;
    }

    RepliStruct::Ptr newStruct;

    // Special case of macros without args, just copy in the args from oldStruct
    if ((src->args.size() == 0) && (oldStruct->args.size() > 0)) {
        newStruct = oldStruct->clone();
        newStruct->cmd = dest->cmd;
        newStruct->label = oldStruct->label;
        return newStruct;
    } else {
        newStruct = dest->clone();
        newStruct->label = oldStruct->label;
    }

    RepliStruct::Ptr findStruct;
    std::vector<RepliStruct::Ptr>::const_iterator iOld(oldStruct->args.begin());

    for (std::vector<RepliStruct::Ptr>::const_iterator iSrc(src->args.begin()), iSrcEnd(src->args.end()); iSrc != iSrcEnd; ++iSrc, ++iOld) {
        // printf("looking for '%s'\n", (*iSrc)->cmd.c_str());
        // find the Atom inside newStruct with the name of iSrc->cmd
        findStruct = newStruct->findAtom((*iSrc)->cmd);

        if (findStruct != nullptr) {
            // overwrite data in findStruct with the matching one from old
            *findStruct = *(*iOld);
        }
    }

    return newStruct;
}